

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

SignatureData *
script_tests::CombineSignatures
          (CTxOut *txout,CMutableTransaction *tx,SignatureData *scriptSig1,SignatureData *scriptSig2
          )

{
  long lVar1;
  SignatureData *in_RCX;
  SignatureData *in_RDI;
  SignatureData *in_R8;
  long in_FS_OFFSET;
  SignatureData *data;
  SignatureData *in_stack_fffffffffffff828;
  int in_stack_fffffffffffff84c;
  CAmount *in_stack_fffffffffffff850;
  uint3 in_stack_fffffffffffff85c;
  uint input_idx;
  SignatureData *in_stack_fffffffffffff8b8;
  SignatureData *in_stack_fffffffffffff8d0;
  SignatureData *in_stack_fffffffffffff8d8;
  SignatureData *in_stack_fffffffffffff940;
  CScript *in_stack_fffffffffffff948;
  BaseSignatureCreator *in_stack_fffffffffffff950;
  SigningProvider *in_stack_fffffffffffff958;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  input_idx = (uint)in_stack_fffffffffffff85c;
  SignatureData::SignatureData(in_stack_fffffffffffff8b8);
  SignatureData::SignatureData(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
  SignatureData::MergeSignatureData(in_RCX,in_R8);
  SignatureData::~SignatureData(in_stack_fffffffffffff828);
  SignatureData::SignatureData(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
  SignatureData::MergeSignatureData(in_RCX,in_R8);
  SignatureData::~SignatureData(in_stack_fffffffffffff828);
  MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
            ((MutableTransactionSignatureCreator *)in_RCX,(CMutableTransaction *)in_R8,input_idx,
             in_stack_fffffffffffff850,in_stack_fffffffffffff84c);
  ProduceSignature(in_stack_fffffffffffff958,in_stack_fffffffffffff950,in_stack_fffffffffffff948,
                   in_stack_fffffffffffff940);
  MutableTransactionSignatureCreator::~MutableTransactionSignatureCreator
            ((MutableTransactionSignatureCreator *)in_stack_fffffffffffff828);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

SignatureData CombineSignatures(const CTxOut& txout, const CMutableTransaction& tx, const SignatureData& scriptSig1, const SignatureData& scriptSig2)
{
    SignatureData data;
    data.MergeSignatureData(scriptSig1);
    data.MergeSignatureData(scriptSig2);
    ProduceSignature(DUMMY_SIGNING_PROVIDER, MutableTransactionSignatureCreator(tx, 0, txout.nValue, SIGHASH_DEFAULT), txout.scriptPubKey, data);
    return data;
}